

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall
add_file::add_file(add_file *this,string *srcname,string *filesystemname,string *romname)

{
  pointer pcVar1;
  
  (this->super_action)._vptr_action = (_func_int **)&PTR__add_file_001466e0;
  (this->_srcpath)._M_dataplus._M_p = (pointer)&(this->_srcpath).field_2;
  pcVar1 = (srcname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_srcpath,pcVar1,pcVar1 + srcname->_M_string_length);
  (this->_fsname)._M_dataplus._M_p = (pointer)&(this->_fsname).field_2;
  pcVar1 = (filesystemname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_fsname,pcVar1,pcVar1 + filesystemname->_M_string_length);
  (this->_romname)._M_dataplus._M_p = (pointer)&(this->_romname).field_2;
  pcVar1 = (romname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_romname,pcVar1,pcVar1 + romname->_M_string_length);
  return;
}

Assistant:

add_file(const std::string&srcname, const std::string& filesystemname, const std::string&romname)
        : _srcpath(srcname), _fsname(filesystemname), _romname(romname)
    {
    }